

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O1

bool __thiscall OpenMD::ifstrstream::is_open(ifstrstream *this)

{
  return this->isRead;
}

Assistant:

bool ifstrstream::is_open() {
#ifdef IS_MPI
    return isRead;
#else
    // single version fall back to ifstream
    return internalFileBuf_.is_open();
#endif
  }